

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

Aig_Man_t * Dar_ManBalance(Aig_Man_t *p,int fUpdateLevel)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Vec_Int_t *pVVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Vec_Vec_t *vStore_00;
  Aig_Obj_t *pAVar8;
  Tim_Man_t *pTVar9;
  void *pvVar10;
  Vec_Ptr_t *p_01;
  float fVar11;
  int local_bc;
  int k;
  Vec_Ptr_t *vLits;
  float arrTime;
  int i;
  Vec_Vec_t *vStore;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pDriver;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int fUpdateLevel_local;
  Aig_Man_t *p_local;
  
  iVar3 = Aig_ManVerifyTopoOrder(p);
  if (iVar3 == 0) {
    __assert_fail("Aig_ManVerifyTopoOrder(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                  ,0x230,"Aig_Man_t *Dar_ManBalance(Aig_Man_t *, int)");
  }
  iVar3 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar3);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  p_00->Time2Quit = p->Time2Quit;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar5 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar5;
  }
  Aig_ManCleanData(p);
  pAVar6 = Aig_ManConst1(p_00);
  pAVar7 = Aig_ManConst1(p);
  (pAVar7->field_5).pData = pAVar6;
  vStore_00 = Vec_VecAlloc(0x32);
  if (p->pManTime == (void *)0x0) {
    for (vLits._4_4_ = 0; iVar3 = Vec_PtrSize(p->vCis), vLits._4_4_ < iVar3;
        vLits._4_4_ = vLits._4_4_ + 1) {
      pvVar10 = Vec_PtrEntry(p->vCis,vLits._4_4_);
      pAVar6 = Aig_ObjCreateCi(p_00);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xff000000ffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)((long)pvVar10 + 0x18) >> 0x20) & 0xffffff) << 0x20;
      *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar6;
    }
    if (p->nBarBufs == 0) {
      for (vLits._4_4_ = 0; iVar3 = Vec_PtrSize(p->vCos), vLits._4_4_ < iVar3;
          vLits._4_4_ = vLits._4_4_ + 1) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,vLits._4_4_);
        pAVar6 = Aig_ObjChild0(pAVar6);
        pAVar6 = Aig_ObjReal_rec(pAVar6);
        pAVar7 = Aig_Regular(pAVar6);
        pAVar7 = Dar_Balance_rec(p_00,pAVar7,vStore_00,0,fUpdateLevel);
        if (pAVar7 == (Aig_Obj_t *)0x0) {
          Vec_VecFree(vStore_00);
          Aig_ManStop(p_00);
          return (Aig_Man_t *)0x0;
        }
        iVar3 = Aig_IsComplement(pAVar6);
        pAVar6 = Aig_NotCond(pAVar7,iVar3);
        Aig_ObjCreateCo(p_00,pAVar6);
      }
    }
    else {
      iVar3 = Aig_ManCoNum(p);
      p_01 = Vec_PtrStart(iVar3);
      for (vLits._4_4_ = 0; iVar3 = Vec_PtrSize(p->vCos), vLits._4_4_ < iVar3;
          vLits._4_4_ = vLits._4_4_ + 1) {
        Vec_PtrEntry(p->vCos,vLits._4_4_);
        if (vLits._4_4_ < p->nBarBufs) {
          local_bc = Aig_ManCoNum(p);
          local_bc = local_bc - p->nBarBufs;
        }
        else {
          local_bc = -p->nBarBufs;
        }
        local_bc = local_bc + vLits._4_4_;
        pAVar6 = Aig_ManCo(p,local_bc);
        pAVar6 = Aig_ObjChild0(pAVar6);
        pAVar6 = Aig_ObjReal_rec(pAVar6);
        pAVar7 = Aig_Regular(pAVar6);
        pAVar7 = Dar_Balance_rec(p_00,pAVar7,vStore_00,0,fUpdateLevel);
        if (pAVar7 == (Aig_Obj_t *)0x0) {
          Vec_VecFree(vStore_00);
          Aig_ManStop(p_00);
          return (Aig_Man_t *)0x0;
        }
        iVar3 = Aig_IsComplement(pAVar6);
        pAVar6 = Aig_NotCond(pAVar7,iVar3);
        Vec_PtrWriteEntry(p_01,local_bc,pAVar6);
        if (vLits._4_4_ < p->nBarBufs) {
          pAVar6 = Aig_Regular(pAVar6);
          uVar2 = *(undefined8 *)&pAVar6->field_0x18;
          iVar3 = Aig_ManCiNum(p);
          pAVar6 = Aig_ManCi(p_00,(iVar3 - p->nBarBufs) + vLits._4_4_);
          *(ulong *)&pAVar6->field_0x18 =
               *(ulong *)&pAVar6->field_0x18 & 0xff000000ffffffff |
               (ulong)((uint)((ulong)uVar2 >> 0x20) & 0xffffff) << 0x20;
        }
      }
      for (vLits._4_4_ = 0; iVar3 = Vec_PtrSize(p->vCos), vLits._4_4_ < iVar3;
          vLits._4_4_ = vLits._4_4_ + 1) {
        Vec_PtrEntry(p->vCos,vLits._4_4_);
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_01,vLits._4_4_);
        Aig_ObjCreateCo(p_00,pAVar6);
      }
      Vec_PtrFree(p_01);
    }
  }
  else {
    Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    Aig_ManSetCioIds(p);
    for (vLits._4_4_ = 0; iVar3 = Vec_PtrSize(p->vObjs), vLits._4_4_ < iVar3;
        vLits._4_4_ = vLits._4_4_ + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,vLits._4_4_);
      if (((pAVar6 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar6), iVar3 == 0)) &&
         (iVar3 = Aig_ObjIsConst1(pAVar6), iVar3 == 0)) {
        iVar3 = Aig_ObjIsCi(pAVar6);
        if (iVar3 == 0) {
          iVar3 = Aig_ObjIsCo(pAVar6);
          if (iVar3 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                          ,0x264,"Aig_Man_t *Dar_ManBalance(Aig_Man_t *, int)");
          }
          pAVar7 = Aig_ObjChild0(pAVar6);
          pAVar7 = Aig_ObjReal_rec(pAVar7);
          pAVar8 = Aig_Regular(pAVar7);
          pAVar8 = Dar_Balance_rec(p_00,pAVar8,vStore_00,0,fUpdateLevel);
          if (pAVar8 == (Aig_Obj_t *)0x0) {
            Vec_VecFree(vStore_00);
            Aig_ManStop(p_00);
            return (Aig_Man_t *)0x0;
          }
          iVar3 = Aig_IsComplement(pAVar7);
          pAVar7 = Aig_NotCond(pAVar8,iVar3);
          pAVar8 = Aig_Regular(pAVar7);
          uVar1 = *(uint *)&pAVar8->field_0x1c;
          pTVar9 = (Tim_Man_t *)p->pManTime;
          iVar3 = Aig_ObjCioId(pAVar6);
          Tim_ManSetCoArrival(pTVar9,iVar3,(float)(uVar1 & 0xffffff));
          Aig_ObjCreateCo(p_00,pAVar7);
        }
        else {
          pAVar7 = Aig_ObjCreateCi(p_00);
          (pAVar6->field_5).pData = pAVar7;
          pTVar9 = (Tim_Man_t *)p->pManTime;
          iVar3 = Aig_ObjCioId(pAVar6);
          fVar11 = Tim_ManGetCiArrival(pTVar9,iVar3);
          *(ulong *)&pAVar7->field_0x18 =
               *(ulong *)&pAVar7->field_0x18 & 0xff000000ffffffff |
               ((ulong)(uint)(int)fVar11 & 0xffffff) << 0x20;
        }
      }
    }
    Aig_ManCleanCioIds(p);
    pTVar9 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar9;
  }
  Vec_VecFree(vStore_00);
  Aig_ManCleanup(p_00);
  iVar3 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar3);
  iVar3 = Aig_ManCheck(p_00);
  if (iVar3 == 0) {
    printf("Dar_ManBalance(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Dar_ManBalance( Aig_Man_t * p, int fUpdateLevel )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pDriver, * pObjNew;
    Vec_Vec_t * vStore;
    int i;
    assert( Aig_ManVerifyTopoOrder(p) );
    // create the new manager 
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    pNew->Time2Quit = p->Time2Quit;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the PI nodes
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    vStore = Vec_VecAlloc( 50 );
    if ( p->pManTime != NULL )
    {
        float arrTime;
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
        Aig_ManSetCioIds( p );
        Aig_ManForEachObj( p, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) || Aig_ObjIsConst1(pObj) )
                continue;
            if ( Aig_ObjIsCi(pObj) )
            {
                // copy the PI
                pObjNew = Aig_ObjCreateCi(pNew); 
                pObj->pData = pObjNew;
                // set the arrival time of the new PI
                arrTime = Tim_ManGetCiArrival( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
                pObjNew->Level = (int)arrTime;
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                // perform balancing
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                // save arrival time of the output
                arrTime = (float)Aig_Regular(pObjNew)->Level;
                Tim_ManSetCoArrival( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj), arrTime );
                // create PO
                pObjNew = Aig_ObjCreateCo( pNew, pObjNew );
            }
            else
                assert( 0 );
        }
        Aig_ManCleanCioIds( p );
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    }
    else
    {
        Aig_ManForEachCi( p, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(pNew); 
            pObjNew->Level = pObj->Level;
            pObj->pData = pObjNew;
        }
        if ( p->nBarBufs == 0 )
        {
            Aig_ManForEachCo( p, pObj, i )
            {
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                pObjNew = Aig_ObjCreateCo( pNew, pObjNew );
            }
        }
        else
        {
            Vec_Ptr_t * vLits = Vec_PtrStart( Aig_ManCoNum(p) );
            Aig_ManForEachCo( p, pObj, i )
            {
                int k = i < p->nBarBufs ? Aig_ManCoNum(p) - p->nBarBufs + i : i - p->nBarBufs;
                pObj = Aig_ManCo( p, k );
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                Vec_PtrWriteEntry( vLits, k, pObjNew );
                if ( i < p->nBarBufs )
                    Aig_ManCi(pNew, Aig_ManCiNum(p) - p->nBarBufs + i)->Level = Aig_Regular(pObjNew)->Level;
            }
            Aig_ManForEachCo( p, pObj, i )
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vLits, i) );
            Vec_PtrFree(vLits);
        }
    }
    Vec_VecFree( vStore );
    // remove dangling nodes
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting AIG
    if ( !Aig_ManCheck(pNew) )
        printf( "Dar_ManBalance(): The check has failed.\n" );
    return pNew;
}